

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.cpp
# Opt level: O3

int __thiscall
TPZSkylNSymMatrix<double>::Subst_LForward(TPZSkylNSymMatrix<double> *this,TPZFMatrix<double> *B)

{
  char cVar1;
  long lVar2;
  double **ppdVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  undefined4 extraout_var;
  int extraout_var_00;
  int iVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  double dVar14;
  long local_50;
  
  lVar9 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  iVar6 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  iVar7 = 0;
  if ((lVar9 == CONCAT44(extraout_var,iVar6)) &&
     ((cVar1 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed, cVar1 == '\x04' ||
      (cVar1 == '\x01')))) {
    iVar6 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0xc])(this);
    iVar7 = 1;
    if (CONCAT44(extraout_var_00,iVar6) != 0 && -1 < extraout_var_00) {
      lVar9 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      local_50 = -8;
      lVar11 = 0;
      do {
        if (0 < lVar9) {
          lVar2 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          lVar12 = 0;
          lVar10 = 0;
          do {
            ppdVar3 = (this->fElemb).fStore;
            pdVar4 = ppdVar3[lVar11 + 1];
            if (lVar2 <= lVar11) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pdVar5 = B->fElem;
            pdVar13 = ppdVar3[lVar11] + 1;
            dVar14 = 0.0;
            if (pdVar13 < pdVar4) {
              pdVar8 = (double *)((long)pdVar5 + lVar2 * lVar12 + local_50);
              do {
                dVar14 = dVar14 + *pdVar13 * *pdVar8;
                pdVar13 = pdVar13 + 1;
                pdVar8 = pdVar8 + -1;
              } while (pdVar13 < pdVar4);
            }
            if ((lVar2 <= lVar11) ||
               (lVar9 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol, lVar9 <= lVar10)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pdVar5[lVar2 * lVar10 + lVar11] = pdVar5[lVar2 * lVar10 + lVar11] - dVar14;
            lVar10 = lVar10 + 1;
            lVar12 = lVar12 + 8;
          } while (lVar10 < lVar9);
        }
        lVar11 = lVar11 + 1;
        local_50 = local_50 + 8;
      } while (lVar11 != CONCAT44(extraout_var_00,iVar6));
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

int TPZSkylNSymMatrix<TVar>::Subst_LForward(TPZFMatrix<TVar> *B)const
{
  if ((B->Rows() != this->Dim()) || (this->fDecomposed != ELDLt && this->fDecomposed != ELU))
    return(0);

  int64_t dimension = this->Dim();
  for (int64_t k = 0; k < dimension; k++)
  {
    for (int64_t j = 0; j < B->Cols(); j++)
    {
      // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
      //
      TVar sum = 0.0;
      TVar *elem_ki = fElemb[k] + 1;
      TVar *end_ki = fElemb[k + 1];
      TVar *BPtr = &(*B)(k, j);
      while (elem_ki < end_ki)
        sum += (*elem_ki++) * (*--BPtr);

      // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
      //
      // B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
      BPtr = &(*B)(k, j);
      *BPtr -= sum;
    }
  }
  return(1);
}